

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O0

LispPTR N_OP_fplus2(LispPTR parg1,LispPTR parg2)

{
  ushort uVar1;
  float *pfVar2;
  LispPTR *pLVar3;
  float *wordp;
  float result;
  float arg2;
  float arg1;
  LispPTR parg2_local;
  LispPTR parg1_local;
  
  if ((parg1 & 0xfff0000) == 0xe0000) {
    result = (float)(parg1 & 0xffff);
  }
  else if ((parg1 & 0xfff0000) == 0xf0000) {
    result = (float)(int)(parg1 | 0xffff0000);
  }
  else {
    uVar1 = *(ushort *)((ulong)(MDStypetbl + (parg1 >> 9)) ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(parg1);
      result = (float)(int)*pLVar3;
    }
    else {
      if (uVar1 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar2 = (float *)NativeAligned4FromLAddr(parg1);
      result = *pfVar2;
    }
  }
  if ((parg2 & 0xfff0000) == 0xe0000) {
    wordp._4_4_ = (float)(parg2 & 0xffff);
  }
  else if ((parg2 & 0xfff0000) == 0xf0000) {
    wordp._4_4_ = (float)(int)(parg2 | 0xffff0000);
  }
  else {
    uVar1 = *(ushort *)((ulong)(MDStypetbl + (parg2 >> 9)) ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(parg2);
      wordp._4_4_ = (float)(int)*pLVar3;
    }
    else {
      if (uVar1 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar2 = (float *)NativeAligned4FromLAddr(parg2);
      wordp._4_4_ = *pfVar2;
    }
  }
  if ((uint)ABS(result + wordp._4_4_) < 0x7f800000) {
    pfVar2 = (float *)createcell68k(3);
    *pfVar2 = result + wordp._4_4_;
    parg2_local = LAddrFromNative(pfVar2);
  }
  else {
    MachineState.errorexit = 1;
    parg2_local = 0xffffffff;
    MachineState.tosvalue = parg2;
  }
  return parg2_local;
}

Assistant:

LispPTR N_OP_fplus2(LispPTR parg1, LispPTR parg2) {
  float arg1;
  float arg2;
  float result;
  float *wordp;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  FPCLEAR;
  result = arg1 + arg2;
  if (FPTEST(result)) ERROR_EXIT(parg2);
  wordp = (float *)createcell68k(TYPE_FLOATP);
  *wordp = result;
  return (LAddrFromNative(wordp));
}